

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  TimingControl *pTVar5;
  ParamAssignmentSyntax *pPVar6;
  SyntaxNode *pSVar7;
  undefined4 extraout_var;
  Delay3Control *pDVar8;
  SourceLocation in_RDX;
  long in_RSI;
  size_t i;
  Expression *delays [3];
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *items;
  TimingControl *in_stack_ffffffffffffff08;
  Compilation *in_stack_ffffffffffffff10;
  SourceRange *args_3;
  ASTContext *in_stack_ffffffffffffff28;
  SourceLocation in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  BumpAllocator *in_stack_ffffffffffffff40;
  DiagCode DVar9;
  undefined1 in_stack_ffffffffffffff58 [16];
  bitmask<slang::ast::ASTFlags> local_80;
  SourceRange local_78;
  undefined4 local_64;
  ulong local_60;
  undefined8 local_58;
  SourceRange SStack_50;
  SourceRange local_40;
  undefined4 local_2c;
  long local_28;
  SourceLocation local_20;
  
  local_28 = in_RSI + 0x38;
  local_20 = in_RDX;
  sVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size
                    ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x12e3c80);
  pSVar7 = in_stack_ffffffffffffff58._8_8_;
  if (sVar4 != 0) {
    sVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size
                      ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x12e3c93);
    pSVar7 = in_stack_ffffffffffffff58._8_8_;
    if (sVar4 < 4) {
      memset(&local_58,0,0x18);
      local_60 = 0;
      while( true ) {
        uVar1 = local_60;
        sVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::size
                          ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)0x12e3d49);
        if (sVar4 <= uVar1) {
          args_3 = &SStack_50;
          slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff58._8_8_);
          pDVar8 = BumpAllocator::
                   emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                             (in_stack_ffffffffffffff40,(Expression *)in_stack_ffffffffffffff38,
                              (Expression **)in_stack_ffffffffffffff30,
                              (Expression **)in_stack_ffffffffffffff28,args_3);
          return &pDVar8->super_TimingControl;
        }
        pPVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
                 operator[]((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)
                            in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
        pSVar7 = in_stack_ffffffffffffff58._8_8_;
        if ((pPVar6->super_SyntaxNode).kind != OrderedParamAssignment) break;
        pSVar7 = &slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::
                  operator[]((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)
                             in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08)->
                  super_SyntaxNode;
        slang::syntax::SyntaxNode::as<slang::syntax::OrderedParamAssignmentSyntax>(pSVar7);
        in_stack_ffffffffffffff30 =
             (SourceLocation)
             not_null<slang::syntax::ExpressionSyntax_*>::operator*
                       ((not_null<slang::syntax::ExpressionSyntax_*> *)0x12e3e2a);
        in_stack_ffffffffffffff38 = local_20;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_80,None);
        iVar3 = Expression::bind(in_stack_ffffffffffffff30._0_4_,
                                 (sockaddr *)in_stack_ffffffffffffff38,(socklen_t)local_80.m_bits);
        (&local_58)[local_60] = CONCAT44(extraout_var,iVar3);
        not_null<const_slang::ast::Type_*>::operator->
                  ((not_null<const_slang::ast::Type_*> *)0x12e3e8a);
        bVar2 = Type::isNumeric((Type *)in_stack_ffffffffffffff10);
        if (!bVar2) {
          sourceRange_01.endLoc = in_stack_ffffffffffffff38;
          sourceRange_01.startLoc = in_stack_ffffffffffffff30;
          ASTContext::addDiag(in_stack_ffffffffffffff28,
                              SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0),sourceRange_01);
          not_null<const_slang::ast::Type_*>::operator*
                    ((not_null<const_slang::ast::Type_*> *)0x12e3eff);
          ast::operator<<(in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_);
          pTVar5 = TimingControl::badCtrl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
          return pTVar5;
        }
        local_60 = local_60 + 1;
      }
      local_64 = 0x540007;
      slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::operator[]
                ((SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *)
                 in_stack_ffffffffffffff10,(size_t)in_stack_ffffffffffffff08);
      DVar9 = local_20._4_4_;
      local_78 = slang::syntax::SyntaxNode::sourceRange(pSVar7);
      sourceRange_00.endLoc = in_stack_ffffffffffffff38;
      sourceRange_00.startLoc = in_stack_ffffffffffffff30;
      ASTContext::addDiag(in_stack_ffffffffffffff28,DVar9,sourceRange_00);
      pTVar5 = TimingControl::badCtrl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      return pTVar5;
    }
  }
  DVar9 = SUB84((ulong)in_stack_ffffffffffffff40 >> 0x20,0);
  local_2c = 0x540007;
  local_40 = slang::syntax::SyntaxNode::sourceRange(pSVar7);
  sourceRange.endLoc = in_stack_ffffffffffffff38;
  sourceRange.startLoc = in_stack_ffffffffffffff30;
  ASTContext::addDiag(in_stack_ffffffffffffff28,DVar9,sourceRange);
  pTVar5 = TimingControl::badCtrl(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  return pTVar5;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    SLANG_ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}